

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::LookupNearest
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,WrapMode2D wrapMode)

{
  undefined1 auVar1 [16];
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  Tuple2<pbrt::Point2,_int> p_00;
  long lVar3;
  Float FVar4;
  undefined8 in_XMM0_Qb;
  float local_5c;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  polymorphic_allocator<float> local_30;
  
  p_00 = (Tuple2<pbrt::Point2,_int>)(long)(int)(this->channelNames).nStored;
  local_58 = p.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_54 = p.super_Tuple2<pbrt::Point2,_float>.y;
  local_5c = 0.0;
  uStack_50 = in_XMM0_Qb;
  local_30.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,(size_t)p_00,
             &local_5c,&local_30);
  if (0 < (int)(this->channelNames).nStored) {
    auVar1._4_4_ = fStack_54;
    auVar1._0_4_ = local_58;
    auVar1._8_8_ = uStack_50;
    local_48 = vmovshdup_avx(auVar1);
    lVar3 = 0;
    do {
      p_00 = (Tuple2<pbrt::Point2,_int>)
             (CONCAT44(p_00.y,(int)((float)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                                   local_58)) |
             (ulong)(uint)(int)((float)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y *
                               (float)local_48._0_4_) << 0x20);
      FVar4 = GetChannel(this,(Point2i)p_00,(int)lVar3,wrapMode);
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar2 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      }
      paVar2->fixed[lVar3] = FVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)(this->channelNames).nStored);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::LookupNearest(Point2f p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    for (int c = 0; c < NChannels(); ++c)
        cv[c] = LookupNearestChannel(p, c, wrapMode);
    return cv;
}